

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_FormatDec_Test::TestBody(FormatterTest_FormatDec_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *pAVar3;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  char buffer [256];
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  undefined7 in_stack_fffffffffffff9c8;
  undefined1 in_stack_fffffffffffff9cf;
  char *in_stack_fffffffffffff9d0;
  AssertHelper *buffer_00;
  char *in_stack_fffffffffffff9d8;
  int iVar4;
  string *expected_expression;
  char *in_stack_fffffffffffff9e0;
  Type in_stack_fffffffffffff9ec;
  Type type;
  AssertHelper *in_stack_fffffffffffff9f0;
  AssertHelper *this_00;
  char (*in_stack_fffffffffffff9f8) [6];
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  AssertHelper *in_stack_fffffffffffffa40;
  AssertHelper *this_01;
  string local_4b0 [32];
  AssertionResult local_490 [2];
  AssertHelper *local_470;
  string local_468 [32];
  AssertionResult local_448 [2];
  undefined8 local_428;
  string local_420 [32];
  AssertionResult local_400 [2];
  undefined4 local_3dc;
  string local_3d8 [32];
  AssertionResult local_3b8 [2];
  undefined4 local_394;
  string local_390 [32];
  AssertionResult local_370 [2];
  undefined4 local_34c;
  string local_348 [32];
  AssertionResult local_328;
  AssertHelper local_318 [35];
  undefined4 local_1fc;
  string local_1f8 [32];
  AssertionResult local_1d8 [2];
  undefined4 local_1b4;
  string local_1b0 [32];
  AssertionResult local_190 [2];
  undefined4 local_16c;
  string local_168 [32];
  AssertionResult local_148 [2];
  undefined4 local_124;
  string local_120 [32];
  AssertionResult local_100 [2];
  undefined4 local_dc;
  string local_d8 [32];
  AssertionResult local_b8 [2];
  undefined4 local_94;
  string local_90 [32];
  AssertionResult local_70 [3];
  undefined4 local_3c;
  string local_38 [32];
  AssertionResult local_18;
  
  local_3c = 0;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [2])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x16775a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x1677bd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x167815);
  local_94 = 0x2a;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x167912);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x167975);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1679cd);
  local_dc = 0x2a;
  fmt::v5::format<char[6],int>(in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x167aca);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x167b2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x167b85);
  local_124 = 0x2a;
  fmt::v5::format<char[4],unsigned_int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(uint *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [3])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x167c82);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x167ce5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x167d3d);
  local_16c = 0xffffffd6;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [4])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_148);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x167e3a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x167e9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x167ef5);
  local_1b4 = 0x3039;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x167ff2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x168055);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1680ad);
  local_1fc = 0x10932;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [6])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1681aa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x16820d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x168265);
  safe_sprintf<256ul>((char (*) [256])local_318,"%d",0x80000000);
  local_34c = 0x80000000;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x168386);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x1683e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x168441);
  safe_sprintf<256ul>((char (*) [256])local_318,"%d",0x7fffffff);
  local_394 = 0x7fffffff;
  fmt::v5::format<char[4],int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(int *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_390);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_370);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x168562);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa40,
               (Message *)CONCAT17(in_stack_fffffffffffffa3f,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x1685c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16861d);
  this_01 = local_318;
  safe_sprintf<256ul>((char (*) [256])this_01,"%u",0xffffffff);
  local_3dc = 0xffffffff;
  fmt::v5::format<char[4],unsigned_int>
            ((char (*) [4])in_stack_fffffffffffff9f8,(uint *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_3d8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x16873e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x16879b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1687f3);
  safe_sprintf<256ul>((char (*) [256])local_318,"%ld");
  local_428 = 0x8000000000000000;
  fmt::v5::format<char[4],long>
            ((char (*) [4])in_stack_fffffffffffff9f8,(long *)in_stack_fffffffffffff9f0);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  std::__cxx11::string::~string(local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_400);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff9f0);
    testing::AssertionResult::failure_message((AssertionResult *)0x16890e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e0,
               (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x16896b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1689c3);
  pAVar3 = local_318;
  this_00 = (AssertHelper *)0x7fffffffffffffff;
  safe_sprintf<256ul>((char (*) [256])pAVar3,"%ld");
  local_470 = this_00;
  fmt::v5::format<char[4],long>((char (*) [4])pAVar3,(long *)this_00);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  iVar4 = (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  std::__cxx11::string::~string(local_468);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9ec);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff9e0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x168ade);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffff9e0,iVar4,in_stack_fffffffffffff9d0);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff9c0);
    testing::Message::~Message((Message *)0x168b3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x168b93);
  buffer_00 = local_318;
  safe_sprintf<256ul>((char (*) [256])buffer_00,"%lu",0xffffffffffffffff);
  expected_expression = local_4b0;
  fmt::v5::format<char[4],unsigned_long>((char (*) [4])pAVar3,(unsigned_long *)this_00);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            ((char *)expected_expression,(char *)buffer_00,
             (char (*) [256])CONCAT17(in_stack_fffffffffffff9cf,in_stack_fffffffffffff9c8),
             in_stack_fffffffffffff9c0);
  iVar4 = (int)((ulong)expected_expression >> 0x20);
  std::__cxx11::string::~string(local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_490);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pAVar3 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x168ca5);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffff9e0,iVar4,(char *)buffer_00);
    testing::internal::AssertHelper::operator=
              (this_01,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa38));
    testing::internal::AssertHelper::~AssertHelper(pAVar3);
    testing::Message::~Message((Message *)0x168d02);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x168d57);
  return;
}

Assistant:

TEST(FormatterTest, FormatDec) {
  EXPECT_EQ("0", format("{0}", 0));
  EXPECT_EQ("42", format("{0}", 42));
  EXPECT_EQ("42", format("{0:d}", 42));
  EXPECT_EQ("42", format("{0}", 42u));
  EXPECT_EQ("-42", format("{0}", -42));
  EXPECT_EQ("12345", format("{0}", 12345));
  EXPECT_EQ("67890", format("{0}", 67890));
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%d", INT_MIN);
  EXPECT_EQ(buffer, format("{0}", INT_MIN));
  safe_sprintf(buffer, "%d", INT_MAX);
  EXPECT_EQ(buffer, format("{0}", INT_MAX));
  safe_sprintf(buffer, "%u", UINT_MAX);
  EXPECT_EQ(buffer, format("{0}", UINT_MAX));
  safe_sprintf(buffer, "%ld", 0 - static_cast<unsigned long>(LONG_MIN));
  EXPECT_EQ(buffer, format("{0}", LONG_MIN));
  safe_sprintf(buffer, "%ld", LONG_MAX);
  EXPECT_EQ(buffer, format("{0}", LONG_MAX));
  safe_sprintf(buffer, "%lu", ULONG_MAX);
  EXPECT_EQ(buffer, format("{0}", ULONG_MAX));
}